

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d717::VectorMerge<unsigned_short>::Run
          (VectorMerge<unsigned_short> *this,istream *input_stream,istream *insert_stream,
          bool *eof_reached)

{
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __first;
  int_type iVar1;
  int iVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *sequence_to_read;
  int *actual_write_size;
  long in_RCX;
  long in_RDI;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __result;
  bool bVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> garbage;
  vector<unsigned_short,_std::allocator<unsigned_short>_> merged_vector;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffef8;
  difference_type in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  size_type in_stack_ffffffffffffff18;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  istream *input_stream_00;
  undefined1 *puVar4;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff60;
  istream local_71 [48];
  undefined1 local_41 [25];
  long local_28;
  byte local_1;
  
  if (((*(byte *)(in_RDI + 0x20) & 1) == 0) || ((*(byte *)(in_RDI + 0x21) & 1) != 0)) {
    sequence_to_read =
         (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(long)*(int *)(in_RDI + 0x14);
    puVar4 = local_41;
    local_28 = in_RCX;
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x10a462);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
               (allocator_type *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x10a488);
    actual_write_size = (int *)(long)*(int *)(in_RDI + 0x1c);
    input_stream_00 = local_71;
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x10a4a8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
               (allocator_type *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x10a4ce);
    do {
      if (0 < *(int *)(in_RDI + 8)) {
        in_stack_fffffffffffffef8 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0;
        in_stack_ffffffffffffff2f =
             sptk::ReadStream<unsigned_short>
                       (SUB81((ulong)in_RDI >> 0x30,0),(int)in_RDI,(int)((ulong)puVar4 >> 0x20),
                        (int)puVar4,sequence_to_read,input_stream_00,
                        (int *)in_stack_ffffffffffffff60._M_current);
        if ((bool)in_stack_ffffffffffffff2f) goto LAB_0010a594;
LAB_0010a760:
        if (local_28 != 0) {
          in_stack_ffffffffffffff10 = std::istream::peek();
          iVar1 = std::char_traits<char>::eof();
          bVar3 = false;
          if (in_stack_ffffffffffffff10 == iVar1) {
            iVar2 = std::istream::peek();
            iVar1 = std::char_traits<char>::eof();
            bVar3 = iVar2 == iVar1;
          }
          *(bool *)local_28 = bVar3;
        }
        local_1 = 1;
        goto LAB_0010a7dc;
      }
LAB_0010a594:
      if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
        in_stack_fffffffffffffef8 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0;
        in_stack_ffffffffffffff17 =
             sptk::ReadStream<unsigned_short>
                       (SUB81((ulong)in_RDI >> 0x30,0),(int)in_RDI,(int)((ulong)puVar4 >> 0x20),
                        (int)puVar4,sequence_to_read,input_stream_00,
                        (int *)in_stack_ffffffffffffff60._M_current);
        if (!(bool)in_stack_ffffffffffffff17) goto LAB_0010a760;
      }
      else {
        __result._M_current = (unsigned_short *)(in_RDI + 0x28);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                  (in_stack_fffffffffffffef8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(in_stack_fffffffffffffef8)
        ;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                  (in_stack_fffffffffffffef8);
        __gnu_cxx::
        __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    in_stack_ffffffffffffff00);
        __first._M_current._7_1_ = in_stack_ffffffffffffff2f;
        __first._M_current._0_7_ = in_stack_ffffffffffffff28;
        in_stack_ffffffffffffff20 =
             std::
             copy<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                       (__first,in_stack_ffffffffffffff20._M_current,__result);
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff20;
      }
      iVar2 = (int)((ulong)puVar4 >> 0x20);
      bVar3 = SUB81((ulong)in_RDI >> 0x30,0);
      if (*(int *)(in_RDI + 0x18) < 1) {
        if (0 < *(int *)(in_RDI + 0x1c)) {
          in_stack_fffffffffffffef8 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0
          ;
          in_stack_ffffffffffffff15 =
               sptk::ReadStream<unsigned_short>
                         (bVar3,(int)in_RDI,iVar2,(int)puVar4,sequence_to_read,input_stream_00,
                          (int *)in_stack_ffffffffffffff60._M_current);
          bVar3 = (bool)in_stack_ffffffffffffff15;
          goto joined_r0x0010a70b;
        }
      }
      else {
        in_stack_fffffffffffffef8 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0;
        in_stack_ffffffffffffff16 =
             sptk::ReadStream<unsigned_short>
                       (bVar3,(int)in_RDI,iVar2,(int)puVar4,sequence_to_read,input_stream_00,
                        (int *)in_stack_ffffffffffffff60._M_current);
        bVar3 = (bool)in_stack_ffffffffffffff16;
joined_r0x0010a70b:
        if (!bVar3) goto LAB_0010a760;
      }
      in_stack_ffffffffffffff14 =
           sptk::WriteStream<unsigned_short>
                     ((int)in_RDI,(int)((ulong)puVar4 >> 0x20),sequence_to_read,
                      (ostream *)input_stream_00,actual_write_size);
    } while ((bool)in_stack_ffffffffffffff14);
    local_1 = 0;
LAB_0010a7dc:
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Run(std::istream* input_stream, std::istream* insert_stream,
           bool* eof_reached) const override {
    if (recursive_ && !has_vector_) {
      return true;
    }

    std::vector<T> merged_vector(merged_length_);
    std::vector<T> garbage(input_skip_length_);
    for (;;) {
      if (0 < insert_point_) {
        if (!sptk::ReadStream(false, 0, 0, insert_point_, &merged_vector,
                              input_stream, NULL)) {
          break;
        }
      }
      if (recursive_) {
        std::copy(insert_vector_.begin(), insert_vector_.end(),
                  merged_vector.begin() + insert_point_);
      } else if (!sptk::ReadStream(false, 0, insert_point_, insert_length_,
                                   &merged_vector, insert_stream, NULL)) {
        break;
      }
      if (0 < input_rest_length_) {
        if (!sptk::ReadStream(
                false, input_skip_length_, insert_point_ + insert_length_,
                input_rest_length_, &merged_vector, input_stream, NULL)) {
          break;
        }
      } else if (0 < input_skip_length_) {
        if (!sptk::ReadStream(false, 0, 0, input_skip_length_, &garbage,
                              input_stream, NULL)) {
          break;
        }
      }
      if (!sptk::WriteStream(0, merged_length_, merged_vector, &std::cout,
                             NULL)) {
        return false;
      }
    }

    if (NULL != eof_reached) {
      *eof_reached =
          (input_stream->peek() == std::istream::traits_type::eof() &&
           insert_stream->peek() == std::istream::traits_type::eof());
    }
    return true;
  }